

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

void __thiscall kj::(anonymous_namespace)::InMemoryFile::~InMemoryFile(InMemoryFile *this)

{
  anon_unknown_35::InMemoryFile::~InMemoryFile((InMemoryFile *)(this + -8));
  return;
}

Assistant:

InMemoryFile(const Clock& clock): impl(clock) {}